

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.h
# Opt level: O2

void gen_uc_traceopcode(TCGContext_conflict9 *tcg_ctx,void *hook,TCGv_i64 arg1,TCGv_i64 arg2,
                       uint32_t size,void *uc,uint64_t pc)

{
  uintptr_t o_2;
  TCGv_i64 pTVar1;
  TCGv_i64 pTVar2;
  TCGv_i64 pTVar3;
  TCGv_i32 pTVar4;
  uintptr_t o;
  uintptr_t o_4;
  uintptr_t o_1;
  uintptr_t o_3;
  TCGTemp *local_68;
  TCGv_i64 local_60;
  TCGv_i64 local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  pTVar1 = tcg_const_i64_tricore(tcg_ctx,(int64_t)hook);
  pTVar2 = tcg_const_i64_tricore(tcg_ctx,(int64_t)uc);
  pTVar3 = tcg_const_i64_tricore(tcg_ctx,pc);
  pTVar4 = tcg_const_i32_tricore(tcg_ctx,size);
  local_60 = arg1 + (long)tcg_ctx;
  local_58 = arg2 + (long)tcg_ctx;
  local_68 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  local_50 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
  local_48 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
  local_40 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
  tcg_gen_callN_tricore(tcg_ctx,helper_uc_traceopcode,(TCGTemp *)0x0,6,&local_68);
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

static inline void gen_uc_traceopcode(TCGContext *tcg_ctx, void* hook, TCGv_i64 arg1, TCGv_i64 arg2, uint32_t size, void *uc, uint64_t pc)
{
    TCGv_ptr thook = tcg_const_ptr(tcg_ctx, hook);
    TCGv_ptr tuc = tcg_const_ptr(tcg_ctx, uc);
    TCGv_i64 tpc = tcg_const_i64(tcg_ctx, pc);
    TCGv_i32 tsz = tcg_const_i32(tcg_ctx, size);
// #if TARGET_LONG_BITS == 32
//     TCGv_i64 targ1 = temp_tcgv_i64(tcg_ctx, tcgv_i32_temp(tcg_ctx, arg1));
//     TCGv_i64 targ2 = temp_tcgv_i64(tcg_ctx, tcgv_i32_temp(tcg_ctx, arg2));
// #else
//     TCGv_i64 targ1 = arg1;
//     TCGv_i64 targ2 = arg2;
// #endif
    gen_helper_uc_traceopcode(tcg_ctx, thook, arg1, arg2, tsz, tuc, tpc);
    tcg_temp_free_i32(tcg_ctx, tsz);
    tcg_temp_free_i64(tcg_ctx, tpc);
    tcg_temp_free_ptr(tcg_ctx, tuc);
    tcg_temp_free_ptr(tcg_ctx, thook);
}